

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void rw::buildPlanes(Camera *cam)

{
  Frame *this;
  Matrix *pMVar1;
  float32 fVar2;
  V3d VVar3;
  undefined8 local_1f8;
  float32 local_1f0;
  V3d local_1e8;
  V3d local_1d8;
  V3d local_1c8;
  V3d local_1b8;
  undefined8 local_1ac;
  float32 local_1a4;
  V3d local_1a0;
  V3d local_190;
  V3d local_180;
  V3d local_170;
  V3d local_160;
  undefined8 local_150;
  float32 local_148;
  V3d local_140;
  V3d local_130;
  V3d local_120;
  V3d local_110;
  V3d local_100;
  undefined8 local_f0;
  float32 local_e8;
  V3d local_e0;
  V3d local_d0;
  V3d local_c0;
  V3d local_b0;
  V3d local_a0;
  undefined8 local_90;
  float32 local_88;
  V3d local_80;
  undefined8 local_70;
  float32 local_68;
  V3d local_60;
  undefined1 local_50 [8];
  V3d v73;
  float32 fStack_3c;
  float32 local_38;
  undefined1 local_30 [8];
  V3d v51;
  FrustumPlane *p;
  V3d *c;
  Camera *cam_local;
  
  register0x00000000 = (V3d *)cam->frustumPlanes;
  VVar3 = sub(cam->frustumCorners + 1,cam->frustumCorners + 5);
  local_38 = VVar3.z;
  v51.x = local_38;
  stack0xffffffffffffffc0 = VVar3._0_8_;
  local_30._0_4_ = v73.z;
  local_30._4_4_ = fStack_3c;
  unique0x10000900 = VVar3;
  VVar3 = sub(cam->frustumCorners + 3,cam->frustumCorners + 7);
  local_60.z = VVar3.z;
  v73.x = local_60.z;
  local_60._0_8_ = VVar3._0_8_;
  local_50._0_4_ = local_60.x;
  local_50._4_4_ = local_60.y;
  local_60 = VVar3;
  this = Camera::getFrame(cam);
  pMVar1 = Frame::getLTM(this);
  stack0xffffffffffffffe0->z = (pMVar1->at).z;
  fVar2 = (pMVar1->at).y;
  stack0xffffffffffffffe0->x = (pMVar1->at).x;
  stack0xffffffffffffffe0->y = fVar2;
  fVar2 = dot(stack0xffffffffffffffe0,cam->frustumCorners + 4);
  stack0xffffffffffffffe0[1].x = fVar2;
  *(bool *)&stack0xffffffffffffffe0[1].y = 0.0 <= (float)stack0xffffffffffffffe0->x;
  *(bool *)((long)&stack0xffffffffffffffe0[1].y + 1) = 0.0 <= (float)stack0xffffffffffffffe0->y;
  *(bool *)((long)&stack0xffffffffffffffe0[1].y + 2) = 0.0 <= (float)stack0xffffffffffffffe0->z;
  VVar3 = neg(stack0xffffffffffffffe0);
  local_80.z = VVar3.z;
  local_68 = local_80.z;
  local_80._0_8_ = VVar3._0_8_;
  local_70._0_4_ = local_80.x;
  local_70._4_4_ = local_80.y;
  stack0xffffffffffffffe0[2].y = local_80.z;
  *(undefined8 *)&stack0xffffffffffffffe0[1].z = local_80._0_8_;
  local_80 = VVar3;
  fVar2 = dot((V3d *)&stack0xffffffffffffffe0[1].z,cam->frustumCorners);
  stack0xffffffffffffffe0[2].z = fVar2;
  *(bool *)&stack0xffffffffffffffe0[3].x = 0.0 <= (float)stack0xffffffffffffffe0[1].z;
  *(bool *)((long)&stack0xffffffffffffffe0[3].x + 1) = 0.0 <= (float)stack0xffffffffffffffe0[2].x;
  *(bool *)((long)&stack0xffffffffffffffe0[3].x + 2) = 0.0 <= (float)stack0xffffffffffffffe0[2].y;
  VVar3 = sub(cam->frustumCorners + 6,cam->frustumCorners + 5);
  local_c0.z = VVar3.z;
  local_b0.z = local_c0.z;
  local_c0._0_8_ = VVar3._0_8_;
  local_b0.x = local_c0.x;
  local_b0.y = local_c0.y;
  local_c0 = VVar3;
  VVar3 = cross((V3d *)local_30,&local_b0);
  local_d0.z = VVar3.z;
  local_a0.z = local_d0.z;
  local_d0._0_8_ = VVar3._0_8_;
  local_a0.x = local_d0.x;
  local_a0.y = local_d0.y;
  local_d0 = VVar3;
  VVar3 = normalize(&local_a0);
  local_e0.z = VVar3.z;
  local_88 = local_e0.z;
  local_e0._0_8_ = VVar3._0_8_;
  local_90._0_4_ = local_e0.x;
  local_90._4_4_ = local_e0.y;
  stack0xffffffffffffffe0[4].x = local_e0.z;
  stack0xffffffffffffffe0[3].y = local_e0.x;
  stack0xffffffffffffffe0[3].z = local_e0.y;
  local_e0 = VVar3;
  fVar2 = dot((V3d *)&stack0xffffffffffffffe0[3].y,cam->frustumCorners + 1);
  stack0xffffffffffffffe0[4].y = fVar2;
  *(bool *)&stack0xffffffffffffffe0[4].z = 0.0 <= (float)stack0xffffffffffffffe0[3].y;
  *(bool *)((long)&stack0xffffffffffffffe0[4].z + 1) = 0.0 <= (float)stack0xffffffffffffffe0[3].z;
  *(bool *)((long)&stack0xffffffffffffffe0[4].z + 2) = 0.0 <= (float)stack0xffffffffffffffe0[4].x;
  VVar3 = sub(cam->frustumCorners + 4,cam->frustumCorners + 5);
  local_120.z = VVar3.z;
  local_110.z = local_120.z;
  local_120._0_8_ = VVar3._0_8_;
  local_110.x = local_120.x;
  local_110.y = local_120.y;
  local_120 = VVar3;
  VVar3 = cross(&local_110,(V3d *)local_30);
  local_130.z = VVar3.z;
  local_100.z = local_130.z;
  local_130._0_8_ = VVar3._0_8_;
  local_100.x = local_130.x;
  local_100.y = local_130.y;
  local_130 = VVar3;
  VVar3 = normalize(&local_100);
  local_140.z = VVar3.z;
  local_e8 = local_140.z;
  local_140._0_8_ = VVar3._0_8_;
  local_f0._0_4_ = local_140.x;
  local_f0._4_4_ = local_140.y;
  stack0xffffffffffffffe0[5].z = local_140.z;
  stack0xffffffffffffffe0[5].x = local_140.x;
  stack0xffffffffffffffe0[5].y = local_140.y;
  local_140 = VVar3;
  fVar2 = dot(stack0xffffffffffffffe0 + 5,cam->frustumCorners + 1);
  stack0xffffffffffffffe0[6].x = fVar2;
  *(bool *)&stack0xffffffffffffffe0[6].y = 0.0 <= (float)stack0xffffffffffffffe0[5].x;
  *(bool *)((long)&stack0xffffffffffffffe0[6].y + 1) = 0.0 <= (float)stack0xffffffffffffffe0[5].y;
  *(bool *)((long)&stack0xffffffffffffffe0[6].y + 2) = 0.0 <= (float)stack0xffffffffffffffe0[5].z;
  VVar3 = sub(cam->frustumCorners + 4,cam->frustumCorners + 7);
  local_180.z = VVar3.z;
  local_170.z = local_180.z;
  local_180._0_8_ = VVar3._0_8_;
  local_170.x = local_180.x;
  local_170.y = local_180.y;
  local_180 = VVar3;
  VVar3 = cross((V3d *)local_50,&local_170);
  local_190.z = VVar3.z;
  local_160.z = local_190.z;
  local_190._0_8_ = VVar3._0_8_;
  local_160.x = local_190.x;
  local_160.y = local_190.y;
  local_190 = VVar3;
  VVar3 = normalize(&local_160);
  local_1a0.z = VVar3.z;
  local_148 = local_1a0.z;
  local_1a0._0_8_ = VVar3._0_8_;
  local_150._0_4_ = local_1a0.x;
  local_150._4_4_ = local_1a0.y;
  stack0xffffffffffffffe0[7].y = local_1a0.z;
  *(undefined8 *)&stack0xffffffffffffffe0[6].z = local_1a0._0_8_;
  local_1a0 = VVar3;
  fVar2 = dot((V3d *)&stack0xffffffffffffffe0[6].z,cam->frustumCorners + 3);
  stack0xffffffffffffffe0[7].z = fVar2;
  *(bool *)&stack0xffffffffffffffe0[8].x = 0.0 <= (float)stack0xffffffffffffffe0[6].z;
  *(bool *)((long)&stack0xffffffffffffffe0[8].x + 1) = 0.0 <= (float)stack0xffffffffffffffe0[7].x;
  *(bool *)((long)&stack0xffffffffffffffe0[8].x + 2) = 0.0 <= (float)stack0xffffffffffffffe0[7].y;
  VVar3 = sub(cam->frustumCorners + 6,cam->frustumCorners + 7);
  local_1d8.z = VVar3.z;
  local_1c8.z = local_1d8.z;
  local_1d8._0_8_ = VVar3._0_8_;
  local_1c8.x = local_1d8.x;
  local_1c8.y = local_1d8.y;
  VVar3 = cross(&local_1c8,(V3d *)local_50);
  local_1e8.z = VVar3.z;
  local_1b8.z = local_1e8.z;
  local_1e8._0_8_ = VVar3._0_8_;
  local_1b8.x = local_1e8.x;
  local_1b8.y = local_1e8.y;
  VVar3 = normalize(&local_1b8);
  local_1f8 = VVar3._0_8_;
  local_1ac = local_1f8;
  local_1f0 = VVar3.z;
  local_1a4 = local_1f0;
  stack0xffffffffffffffe0[8].y = (float32)(undefined4)local_1f8;
  stack0xffffffffffffffe0[8].z = (float32)local_1f8._4_4_;
  stack0xffffffffffffffe0[9].x = local_1f0;
  fVar2 = dot((V3d *)&stack0xffffffffffffffe0[8].y,cam->frustumCorners + 3);
  stack0xffffffffffffffe0[9].y = fVar2;
  *(bool *)&stack0xffffffffffffffe0[9].z = 0.0 <= (float)stack0xffffffffffffffe0[8].y;
  *(bool *)((long)&stack0xffffffffffffffe0[9].z + 1) = 0.0 <= (float)stack0xffffffffffffffe0[8].z;
  *(bool *)((long)&stack0xffffffffffffffe0[9].z + 2) = 0.0 <= (float)stack0xffffffffffffffe0[9].x;
  return;
}

Assistant:

static void
buildPlanes(Camera *cam)
{
	V3d *c = cam->frustumCorners;
	FrustumPlane *p = cam->frustumPlanes;
	V3d v51 = sub(c[1], c[5]);
	V3d v73 = sub(c[3], c[7]);

	/* Far plane */
	p[0].plane.normal = cam->getFrame()->getLTM()->at;
	p[0].plane.distance = dot(p[0].plane.normal, c[4]);
	p[0].closestX = p[0].plane.normal.x < 0.0f ? 0 : 1;
	p[0].closestY = p[0].plane.normal.y < 0.0f ? 0 : 1;
	p[0].closestZ = p[0].plane.normal.z < 0.0f ? 0 : 1;

	/* Near plane */
	p[1].plane.normal = neg(p[0].plane.normal);
	p[1].plane.distance = dot(p[1].plane.normal, c[0]);
	p[1].closestX = p[1].plane.normal.x < 0.0f ? 0 : 1;
	p[1].closestY = p[1].plane.normal.y < 0.0f ? 0 : 1;
	p[1].closestZ = p[1].plane.normal.z < 0.0f ? 0 : 1;

	/* Right plane */
	p[2].plane.normal = normalize(cross(v51,
	                                    sub(c[6], c[5])));
	p[2].plane.distance = dot(p[2].plane.normal, c[1]);
	p[2].closestX = p[2].plane.normal.x < 0.0f ? 0 : 1;
	p[2].closestY = p[2].plane.normal.y < 0.0f ? 0 : 1;
	p[2].closestZ = p[2].plane.normal.z < 0.0f ? 0 : 1;

	/* Top plane */
	p[3].plane.normal = normalize(cross(sub(c[4], c[5]),
	                                    v51));
	p[3].plane.distance = dot(p[3].plane.normal, c[1]);
	p[3].closestX = p[3].plane.normal.x < 0.0f ? 0 : 1;
	p[3].closestY = p[3].plane.normal.y < 0.0f ? 0 : 1;
	p[3].closestZ = p[3].plane.normal.z < 0.0f ? 0 : 1;

	/* Left plane */
	p[4].plane.normal = normalize(cross(v73,
	                                    sub(c[4], c[7])));
	p[4].plane.distance = dot(p[4].plane.normal, c[3]);
	p[4].closestX = p[4].plane.normal.x < 0.0f ? 0 : 1;
	p[4].closestY = p[4].plane.normal.y < 0.0f ? 0 : 1;
	p[4].closestZ = p[4].plane.normal.z < 0.0f ? 0 : 1;

	/* Bottom plane */
	p[5].plane.normal = normalize(cross(sub(c[6], c[7]),
	                                    v73));
	p[5].plane.distance = dot(p[5].plane.normal, c[3]);
	p[5].closestX = p[5].plane.normal.x < 0.0f ? 0 : 1;
	p[5].closestY = p[5].plane.normal.y < 0.0f ? 0 : 1;
	p[5].closestZ = p[5].plane.normal.z < 0.0f ? 0 : 1;
}